

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O2

void __thiscall
pstd::
vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::reserve(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *this,size_t n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  long lVar2;
  int i;
  ulong uVar3;
  
  if (this->nAlloc < n) {
    pbVar1 = pmr::polymorphic_allocator<std::__cxx11::string>::allocate_object<std::__cxx11::string>
                       ((polymorphic_allocator<std::__cxx11::string> *)this,n);
    lVar2 = 0;
    for (uVar3 = 0; uVar3 < this->nStored; uVar3 = uVar3 + 1) {
      std::__cxx11::string::string
                ((string *)((long)&(pbVar1->_M_dataplus)._M_p + lVar2),
                 (string *)((long)&(this->ptr->_M_dataplus)._M_p + lVar2));
      std::__cxx11::string::~string((string *)((long)&(this->ptr->_M_dataplus)._M_p + lVar2));
      lVar2 = lVar2 + 0x20;
    }
    pmr::polymorphic_allocator<std::__cxx11::string>::deallocate_object<std::__cxx11::string>
              ((polymorphic_allocator<std::__cxx11::string> *)this,this->ptr,this->nAlloc);
    this->nAlloc = n;
    this->ptr = pbVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }